

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

void __thiscall CStorage::LoadPaths(CStorage *this)

{
  long lVar1;
  IOHANDLE IoHandle;
  char *pcVar2;
  long in_FS_OFFSET;
  CLineReader LineReader;
  
  LineReader.m_aBuffer[0x28] = '\0';
  LineReader.m_aBuffer[0x29] = '\0';
  LineReader.m_aBuffer[0x2a] = '\0';
  LineReader.m_aBuffer[0x2b] = '\0';
  LineReader.m_aBuffer[0x2c] = '\0';
  LineReader.m_aBuffer[0x2d] = '\0';
  LineReader.m_aBuffer[0x2e] = '\0';
  LineReader.m_aBuffer[0x2f] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  IoHandle = io_open("storage.cfg",9);
  if (IoHandle == (IOHANDLE)0x0) {
    str_copy(LineReader.m_aBuffer,this->m_aAppDir,0x200);
    str_append(LineReader.m_aBuffer,"/storage.cfg",0x200);
    IoHandle = io_open(LineReader.m_aBuffer,9);
    if (IoHandle != (IOHANDLE)0x0) goto LAB_0013a49f;
    pcVar2 = "couldn\'t open storage.cfg";
  }
  else {
LAB_0013a49f:
    CLineReader::Init(&LineReader,IoHandle);
    while (pcVar2 = CLineReader::Get(&LineReader), pcVar2 != (char *)0x0) {
      pcVar2 = str_startswith(pcVar2,"add_path ");
      if (pcVar2 != (char *)0x0) {
        AddPath(this,pcVar2);
      }
    }
    io_close(IoHandle);
    if (this->m_NumPaths != 0) goto LAB_0013a514;
    pcVar2 = "no paths found in storage.cfg";
  }
  dbg_msg("storage",pcVar2);
LAB_0013a514:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void LoadPaths()
	{
		// check current directory
		IOHANDLE File = io_open("storage.cfg", IOFLAG_READ | IOFLAG_SKIP_BOM);
		if(!File)
		{
			// check usable path in argv[0]
			char aBuffer[IO_MAX_PATH_LENGTH];
			str_copy(aBuffer, m_aAppDir, sizeof(aBuffer));
			str_append(aBuffer, "/storage.cfg", sizeof(aBuffer));
			File = io_open(aBuffer, IOFLAG_READ | IOFLAG_SKIP_BOM);
			if(!File)
			{
				dbg_msg("storage", "couldn't open storage.cfg");
				return;
			}
		}

		CLineReader LineReader;
		LineReader.Init(File);
		const char *pLine;
		while((pLine = LineReader.Get()))
		{
			const char *pLineWithoutPrefix = str_startswith(pLine, "add_path ");
			if(pLineWithoutPrefix)
			{
				AddPath(pLineWithoutPrefix);
			}
		}

		io_close(File);

		if(!m_NumPaths)
			dbg_msg("storage", "no paths found in storage.cfg");
	}